

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

ssize_t __thiscall inja::Environment::write(Environment *this,int __fd,void *__buf,size_t __n)

{
  pointer pIVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ostream local_228 [8];
  ofstream file;
  string *filename_out_local;
  json *data_local;
  Template *temp_local;
  Environment *this_local;
  
  pIVar1 = std::unique_ptr<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>::
           operator->(&this->m_impl);
  std::operator+(&local_248,&pIVar1->output_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__n);
  std::ofstream::ofstream(local_228,(string *)&local_248,_S_out);
  std::__cxx11::string::~string((string *)&local_248);
  render(&local_278,this,(Template *)CONCAT44(in_register_00000034,__fd),(json *)__buf);
  std::operator<<(local_228,(string *)&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::ofstream::close();
  sVar2 = std::ofstream::~ofstream(local_228);
  return sVar2;
}

Assistant:

void write(const Template& temp, const json& data, const std::string& filename_out) {
		std::ofstream file(m_impl->output_path + filename_out);
		file << render(temp, data);
		file.close();
	}